

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O2

void __thiscall
ConfidentialTxOut_CreateDestroyAmountTxOutTest_Test::TestBody
          (ConfidentialTxOut_CreateDestroyAmountTxOutTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  Amount local_238;
  ConfidentialTxOut local_228;
  int64_t local_130;
  ConfidentialAssetId asset;
  ConfidentialTxOut txout;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&txout);
  std::__cxx11::string::string
            ((string *)&local_228,"1234567890123456789012345678901234567890123456789012345678901234"
             ,(allocator *)&gtest_ar_1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(980000000);
  local_238.amount_ = AVar3.amount_;
  local_238.ignore_check_ = AVar3.ignore_check_;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTxOut::CreateDestroyAmountTxOut(&local_228,&asset,&local_238);
      cfd::core::ConfidentialTxOut::operator=(&txout,&local_228);
      cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_228);
    }
  }
  else {
    testing::Message::Message((Message *)&local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x125,
               "Expected: (txout = ConfidentialTxOut::CreateDestroyAmountTxOut(asset, amount)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_228);
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&local_228,&txout.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&gtest_ar_1,(ConfidentialAssetId *)&local_228);
  pcVar2 = (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar_2,&asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetAsset().GetHex().c_str()","asset.GetHex().c_str()",
             pcVar2,(char *)gtest_ar_2._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&local_228);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_228);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x126,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_228);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&local_228,&txout.confidential_value_);
  AVar3 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)&local_228);
  gtest_ar_2._0_8_ = AVar3.amount_;
  gtest_ar_2.message_.ptr_._0_1_ = AVar3.ignore_check_;
  gtest_ar._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar_2);
  local_130 = cfd::core::Amount::GetSatoshiValue(&local_238);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar_1,"txout.GetConfidentialValue().GetAmount().GetSatoshiValue()",
             "amount.GetSatoshiValue()",(long *)&gtest_ar,&local_130);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_228);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_228);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_228);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)&local_228,&txout.super_AbstractTxOut);
  cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar_1,(Script *)&local_228);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txout.GetLockingScript().ToString().c_str()","\"OP_RETURN\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),"OP_RETURN");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::Script::~Script((Script *)&local_228);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_228);
    if ((undefined8 *)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x129,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_228);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&txout);
  return;
}

Assistant:

TEST(ConfidentialTxOut, CreateDestroyAmountTxOutTest) {  
  ConfidentialTxOut txout;
  ConfidentialAssetId asset("1234567890123456789012345678901234567890123456789012345678901234");
  Amount amount = Amount::CreateBySatoshiAmount(980000000);
  EXPECT_NO_THROW((txout = ConfidentialTxOut::CreateDestroyAmountTxOut(asset, amount)));
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
            amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().ToString().c_str(), "OP_RETURN");
}